

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_tree.cpp
# Opt level: O0

bool __thiscall la::trie_tree::search(trie_tree *this,string *key)

{
  size_type sVar1;
  const_reference c;
  size_t __n;
  reference pptVar2;
  byte local_41;
  size_t ci;
  size_type i;
  trie_node *cur_node;
  string *key_local;
  trie_tree *this_local;
  
  i = (size_type)this->_root_node;
  ci = 0;
  while( true ) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (key);
    if (sVar1 <= ci) {
      local_41 = 0;
      if (i != 0) {
        local_41 = *(byte *)(i + 0x140);
      }
      return (bool)(local_41 & 1);
    }
    c = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                  (key,ci);
    __n = trie_node::convertIndex(c);
    pptVar2 = std::array<la::trie_node_*,_40UL>::operator[]((array<la::trie_node_*,_40UL> *)i,__n);
    if (*pptVar2 == (value_type)0x0) break;
    pptVar2 = std::array<la::trie_node_*,_40UL>::operator[]((array<la::trie_node_*,_40UL> *)i,__n);
    i = (size_type)*pptVar2;
    ci = ci + 1;
  }
  return false;
}

Assistant:

bool trie_tree::search(const std::string &key)
    {
        auto cur_node{_root_node};
        for (decltype(key.size()) i{0}; i < key.size(); ++i)
        {
            const auto ci{trie_node::convertIndex(key[i])};
            if (cur_node->_children[ci] == nullptr)
                return false;
            cur_node = cur_node->_children[ci];
        }
        return (cur_node != nullptr && cur_node->_is_end_word);
    }